

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RepeatLoopIfSetInst::Exec
          (RepeatLoopIfSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  int minGroupId;
  int maxGroupId;
  bool bVar2;
  uint uVar3;
  BeginLoopIfSetInst *pBVar4;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  uint8 *puVar5;
  Label label;
  
  pBVar4 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopIfSetInst>
                     (matcher,BeginLoopIfSet,(this->super_RepeatLoopMixin).beginLabel);
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId
                           );
  if ((pBVar4->super_BeginLoopMixin).hasInnerNondet == true) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo
               ,matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar3 = origLoopInfo->number + 1;
  origLoopInfo->number = uVar3;
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if (*inputOffset < inputLength) {
    bVar2 = RuntimeCharSet<char16_t>::Get(&(pBVar4->super_SetMixin<false>).set,input[*inputOffset]);
    if (bVar2) {
      uVar3 = (pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper;
      if ((uVar3 != 0xffffffff) && (uVar3 <= origLoopInfo->number)) goto LAB_00d4e016;
      minGroupId = (pBVar4->super_BodyGroupsMixin).minBodyGroupId;
      maxGroupId = (pBVar4->super_BodyGroupsMixin).maxBodyGroupId;
      if ((pBVar4->super_BeginLoopMixin).hasInnerNondet == true) {
        Matcher::SaveInnerGroups(matcher,minGroupId,maxGroupId,true,input,contStack);
      }
      else {
        Matcher::ResetInnerGroups(matcher,minGroupId,maxGroupId);
      }
      label = (this->super_RepeatLoopMixin).beginLabel + 0x43;
      goto LAB_00d4e044;
    }
    uVar3 = origLoopInfo->number;
  }
  if (uVar3 < (pBVar4->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
LAB_00d4e016:
    bVar2 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    return bVar2;
  }
  label = (pBVar4->super_BeginLoopMixin).exitLabel;
LAB_00d4e044:
  puVar5 = Matcher::LabelToInstPointer(matcher,label);
  *instPointer = puVar5;
  return false;
}

Assistant:

inline bool RepeatLoopIfSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopIfSetInst* begin = matcher.L2I(BeginLoopIfSet, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (begin->hasInnerNondet)
        {
            // May end up backtracking into loop body for iteration just completed: see above.
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && begin->set.Get(input[inputOffset]))
        {
            if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
            {
                // If the loop body's first set and the loop's follow set are disjoint, we can just fail here since
                // we know the next character in the input is in the loop body's first set.
                return matcher.Fail(FAIL_PARAMETERS);
            }

            // Commit to one more iteration
            if (begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopIfSetInst));
            return false;
        }

        if (loopInfo->number < begin->repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        // Proceed to exit
        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return false;
    }